

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_test.c
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  ulong uVar4;
  void *buf;
  undefined8 uVar5;
  ulong uVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  int *piVar10;
  int *piVar11;
  uint uVar12;
  ulong uVar14;
  size_t __size;
  int iVar15;
  int iVar17;
  double dVar16;
  int iVar18;
  int iVar19;
  int hiC [2];
  int loC [2];
  int rank;
  int ld;
  int loA [2];
  int lds;
  int ldC;
  int lda;
  int ldb;
  int loB [2];
  int bhi [2];
  int ahi [2];
  int pdy;
  int pdx;
  int nprocs;
  int one;
  int dims [2];
  int blo [2];
  int alo [2];
  uint local_170;
  uint uStack_16c;
  uint local_168 [3];
  uint local_15c;
  ulong local_158;
  ulong local_150;
  int local_144;
  uint local_140;
  int local_13c;
  uint local_138;
  uint uStack_134;
  undefined8 local_130;
  uint local_128;
  int local_124;
  int local_120;
  int local_11c;
  void *local_118;
  uint local_110;
  uint local_10c;
  int *local_108;
  void *local_100;
  uint local_f8;
  uint local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  uint local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  undefined8 local_d0;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  int local_b8;
  int local_b4;
  int local_b0 [2];
  ulong local_a8;
  int local_a0;
  int local_9c;
  int local_98 [4];
  char *local_88;
  double local_80;
  void *local_78;
  void *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 local_3c [4];
  undefined1 local_38 [8];
  ulong uVar13;
  
  local_b0[1] = 1;
  MPI_Init(local_3c,local_38);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_15c);
  MPI_Comm_size(&ompi_mpi_comm_world,local_b0);
  MA_init(0x3e9,1000,1000);
  GA_Initialize();
  local_b0[0] = GA_Nnodes();
  local_15c = GA_Nodeid();
  uVar5 = CONCAT71((uint7)(uint3)(local_15c >> 8),1);
  do {
    local_f8 = (uint)uVar5;
    local_88 = "read_cache";
    if ((char)uVar5 != '\0') {
      local_88 = "read_only";
    }
    local_158 = 4;
    do {
      if (local_15c == 0) {
        fprintf(_stderr,"dim:%d start\n",local_158);
      }
      local_d8 = (int)local_158;
      uVar12 = local_d8 * local_d8;
      uVar13 = (ulong)uVar12;
      local_98[2] = 0;
      local_98[3] = 0;
      local_170 = local_d8 - 1;
      local_98[0] = 0;
      local_98[1] = 0;
      local_168[0] = 0;
      local_168[1] = 0;
      local_130 = 0;
      local_d0 = 0;
      uStack_16c = local_170;
      local_138 = local_170;
      uStack_134 = local_170;
      local_110 = local_170;
      local_10c = local_170;
      local_f4 = local_170;
      local_d4 = local_d8;
      local_c8 = local_170;
      local_c4 = local_170;
      local_c0 = local_170;
      local_bc = local_170;
      local_a0 = local_d8;
      local_9c = local_d8;
      pvVar3 = malloc((ulong)(uVar12 * 4));
      uVar4 = 0;
      if (uVar12 == 0) {
        do {
          *(int *)((long)pvVar3 + uVar4 * 4) = (int)uVar4;
          uVar4 = uVar4 + 1;
        } while (uVar13 != uVar4);
      }
      else {
        iVar15 = 0;
        iVar17 = 1;
        iVar18 = 2;
        iVar19 = 3;
        do {
          piVar10 = (int *)((long)pvVar3 + uVar4 * 4);
          *piVar10 = iVar15;
          piVar10[1] = iVar17;
          piVar10[2] = iVar18;
          piVar10[3] = iVar19;
          uVar4 = uVar4 + 4;
          iVar15 = iVar15 + 4;
          iVar17 = iVar17 + 4;
          iVar18 = iVar18 + 4;
          iVar19 = iVar19 + 4;
        } while (uVar13 != uVar4);
      }
      buf = malloc((ulong)(uVar12 * 4));
      uVar4 = 0;
      if (uVar13 == 0) {
        do {
          *(int *)((long)buf + uVar4 * 4) = (int)uVar4;
          uVar4 = uVar4 + 1;
        } while (uVar4 != 0);
      }
      else {
        iVar15 = 0;
        iVar17 = 1;
        iVar18 = 2;
        iVar19 = 3;
        do {
          piVar10 = (int *)((long)buf + uVar4 * 4);
          *piVar10 = iVar15;
          piVar10[1] = iVar17;
          piVar10[2] = iVar18;
          piVar10[3] = iVar19;
          uVar4 = uVar4 + 4;
          iVar15 = iVar15 + 4;
          iVar17 = iVar17 + 4;
          iVar18 = iVar18 + 4;
          iVar19 = iVar19 + 4;
        } while (uVar13 != uVar4);
      }
      iVar15 = NGA_Create(0x3e9,2,&local_a0,"array_A",(int *)0x0);
      iVar17 = NGA_Create(0x3e9,2,&local_a0,"array_B",(int *)0x0);
      iVar18 = NGA_Create(0x3e9,2,&local_a0,"array_C",(int *)0x0);
      GA_Zero(iVar15);
      GA_Zero(iVar17);
      local_120 = iVar18;
      GA_Zero(iVar18);
      local_70 = pvVar3;
      NGA_Put(iVar15,local_98 + 2,(int *)&local_c0,pvVar3,&local_d8);
      local_78 = buf;
      NGA_Put(iVar17,local_98,(int *)&local_c8,buf,&local_d4);
      GA_Sync();
      pcVar8 = local_88;
      local_144 = iVar15;
      NGA_Set_property(iVar15,local_88);
      local_11c = iVar17;
      NGA_Set_property(iVar17,pcVar8);
      GA_Sync();
      local_80 = GA_Wtime();
      grid_factor(local_b0[0],&local_b4,&local_b8);
      local_e8 = local_b4;
      lVar1 = (long)local_b4;
      lVar2 = (long)(int)local_15c;
      local_128 = (int)local_15c % local_b4;
      uVar13 = lVar2 / lVar1 & 0xffffffff;
      uVar4 = local_158 >> 1 & 0x7fffffff;
      iVar15 = (int)((local_158 & 0xffffffff) / uVar4);
      local_124 = (int)uVar4;
      iVar15 = iVar15 + (uint)((uint)(iVar15 * local_124) < (uint)local_158);
      GA_Sync();
      local_ec = iVar15;
      if ((int)(lVar2 / lVar1) < iVar15) {
        local_f0 = local_b8;
        uVar12 = local_128;
        do {
          local_a8 = (ulong)uVar12;
          local_168[0] = uVar12 * local_124;
          local_168[1] = (int)uVar13 * local_124;
          iVar15 = (uVar12 + 1) * local_124;
          uStack_16c = ((int)uVar13 + 1) * local_124 - 1;
          local_170 = iVar15 - 1;
          if ((int)(uint)local_158 < iVar15) {
            local_170 = local_f4;
          }
          uVar12 = local_168[0];
          uVar7 = local_168[1];
          local_68 = uVar13;
          if ((int)local_170 < (int)local_168[0]) {
            fprintf(_stderr,"%d: bad values for HiC LoC: %d  %d\n",(ulong)local_15c,(ulong)local_170
                    ,(ulong)local_168[0]);
            fprintf(_stderr,"%dL xcnt xbl: %d  %d\n",(ulong)local_15c,local_a8);
            GA_Error("cache_test: div by zero",0);
            uVar12 = local_168[0];
            uVar7 = local_168[1];
          }
          iVar19 = (local_170 - uVar12) + 1;
          iVar18 = (int)local_158;
          iVar15 = (int)((long)((ulong)(uint)(iVar18 >> 0x1f) << 0x20 | local_158 & 0xffffffff) /
                        (long)iVar19);
          local_150 = CONCAT44(local_150._4_4_,iVar15);
          iVar17 = (uStack_16c - uVar7) + 1;
          __size = (size_t)(iVar19 * iVar17 * 4);
          local_118 = malloc(__size);
          local_100 = malloc(__size);
          local_108 = (int *)malloc(__size);
          local_60 = (long)(int)uVar12 / (long)iVar19 & 0xffffffff;
          uVar7 = (uint)(iVar19 * iVar15 < iVar18);
          uVar12 = uVar7 + (int)local_150;
          local_dc = iVar17;
          if (uVar12 != 0 && SCARRY4(uVar7,(int)local_150) == (int)uVar12 < 0) {
            uVar4 = 0;
            local_e4 = uVar12;
            do {
              iVar17 = ((int)local_60 + (int)uVar4) % (int)local_e4;
              local_138 = local_170;
              local_13c = (local_170 - local_168[0]) + 1;
              iVar15 = local_13c * iVar17 + local_98[3];
              local_130 = CONCAT44(iVar15,local_168[0]);
              uStack_134 = iVar15 + (local_170 - local_168[0]);
              if ((int)local_bc <= (int)uStack_134) {
                uStack_134 = local_bc;
              }
              local_58 = uVar4;
              NGA_Get(local_144,(int *)&local_130,(int *)&local_138,local_100,&local_13c);
              if (4 < (uint)local_158) {
                pvVar3 = malloc((long)(int)(((local_168[1] ^ 0xffffffff) + uStack_16c) *
                                           ((local_168[0] ^ 0xffffffff) + local_170)) << 2);
                local_50 = CONCAT44(uStack_134 - 1,local_138 - 1);
                local_e0 = (local_138 - 1) - (int)local_130;
                local_48 = CONCAT44((int)((ulong)local_130 >> 0x20) + 1,(int)local_130 + 1);
                NGA_Get(local_144,(int *)&local_48,(int *)&local_50,pvVar3,&local_e0);
              }
              local_10c = uStack_16c;
              iVar15 = ((local_170 - local_168[0]) + 1) * iVar17 + local_98[0];
              local_d0 = CONCAT44(SUB84(local_168._0_8_,4),iVar15);
              local_110 = (local_170 - local_168[0]) + iVar15;
              if ((int)local_c8 <= (int)local_110) {
                local_110 = local_c8;
              }
              local_13c = (local_110 - iVar15) + 1;
              NGA_Get(local_11c,(int *)&local_d0,(int *)&local_110,local_108,&local_13c);
              local_150 = (ulong)local_170;
              if ((int)local_168[0] <= (int)local_170) {
                local_140 = local_168[0];
                iVar15 = uStack_16c - local_168[1];
                uVar13 = (ulong)(iVar15 + 1U);
                uVar4 = (ulong)((local_170 - local_168[0]) + 1);
                uVar12 = 0;
                do {
                  if (-1 < iVar15) {
                    memset((void *)((long)local_118 + (ulong)uVar12 * 4),0,uVar13 * 4);
                  }
                  uVar12 = uVar12 + iVar15 + 1U;
                  uVar4 = uVar4 - 1;
                } while (uVar4 != 0);
                iVar17 = (int)local_150;
                uVar12 = iVar17 - local_140;
                local_150 = (ulong)uVar12;
                if ((int)local_140 <= iVar17) {
                  local_140 = (uStack_134 - local_130._4_4_) + 1;
                  local_150 = (ulong)(uVar12 + 1);
                  uVar4 = 0;
                  uVar9 = 0;
                  do {
                    if (-1 < iVar15) {
                      uVar14 = 0;
                      piVar10 = local_108;
                      do {
                        if (-1 < (int)(uStack_134 - local_130._4_4_)) {
                          iVar17 = *(int *)((long)local_118 + uVar14 * 4 + uVar9 * uVar13 * 4);
                          uVar6 = 0;
                          piVar11 = piVar10;
                          do {
                            iVar17 = iVar17 + *piVar11 *
                                              *(int *)((long)local_100 + uVar6 * 4 + uVar4 * 4);
                            uVar6 = uVar6 + 1;
                            piVar11 = piVar11 + uVar13;
                          } while (local_140 != uVar6);
                          *(int *)((long)local_118 + uVar14 * 4 + uVar9 * uVar13 * 4) = iVar17;
                        }
                        uVar14 = uVar14 + 1;
                        piVar10 = piVar10 + 1;
                      } while (uVar14 != uVar13);
                    }
                    uVar9 = uVar9 + 1;
                    uVar4 = (ulong)((int)uVar4 + local_140);
                  } while (uVar9 != local_150);
                }
              }
              NGA_Acc(local_120,(int *)local_168,(int *)&local_170,local_118,&local_dc,local_b0 + 1)
              ;
              uVar12 = (int)local_58 + 1;
              uVar4 = (ulong)uVar12;
            } while (uVar12 != local_e4);
          }
          free(local_100);
          free(local_108);
          free(local_118);
          uVar7 = (int)local_a8 + local_e8;
          uVar12 = local_128;
          iVar15 = local_f0;
          if ((int)uVar7 < local_ec) {
            uVar12 = uVar7;
            iVar15 = 0;
          }
          uVar13 = (ulong)(uint)(iVar15 + (int)local_68);
        } while (iVar15 + (int)local_68 < local_ec);
      }
      dVar16 = GA_Wtime();
      uVar12 = local_f8;
      pcVar8 = "READ  - DIMSIZE: %5d  Time (us): %7.4f\n";
      if ((((byte)local_f8 & local_15c == 0) != 0) ||
         (pcVar8 = "CACHE - DIMSIZE: %5d  Time (us): %7.4f\n", local_15c == 0 && (local_f8 & 1) == 0
         )) {
        printf(pcVar8,(dVar16 - local_80) * 1000000.0,local_158);
      }
      GA_Sync();
      iVar15 = local_144;
      NGA_Unset_property(local_144);
      iVar17 = local_11c;
      NGA_Unset_property(local_11c);
      GA_Destroy(iVar15);
      GA_Destroy(iVar17);
      GA_Destroy(local_120);
      free(local_70);
      free(local_78);
      uVar7 = (uint)local_158;
      local_158 = (ulong)(uVar7 * 2);
    } while (uVar7 < 0x801);
    uVar5 = 0;
  } while ((uVar12 & 1) != 0);
  GA_Terminate();
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char **argv) {

  int g_a, g_b, g_c;
  int one = 1;
  int rank, nprocs, kdim;
  int i, j, k;
  int ipx, ipy;
  int pdx, pdy;
  int xdim, ydim;
  int xbl, ybl;
  int xcdim, ycdim;
  int xnbl, ynbl;
  int xcnt, ycnt;
  int nb, ind, istart;
  int local_test;
  int ldtest = 5;
  int *local_A = NULL;
  int *local_B = NULL;
  double delta_t;
  int test;
  int dimsize;

  MPI_Init(&argc, &argv);

  MPI_Comm_rank(MPI_COMM_WORLD, &rank);
  MPI_Comm_size(MPI_COMM_WORLD, &nprocs);

  MA_init(C_INT, 1000, 1000);
  GA_Initialize();

  nprocs = GA_Nnodes();  
  rank = GA_Nodeid();   

  for (test = 0; test <= 1; test++) {
    for (dimsize = 4; dimsize <=4096; dimsize *= 2){
      if (rank == 0) fprintf(stderr,"dim:%d start\n",dimsize);

      int *abuf, *bbuf, *cbuf, *ctest;
      int full_size = dimsize*dimsize;
      int alo[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int ahi[DIM] = {dimsize-1,dimsize-1};
      int blo[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int bhi[DIM] = {dimsize-1,dimsize-1};
      int clo[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int chi[DIM] = {dimsize-1,dimsize-1};
      int loC[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int hiC[DIM] = {dimsize-1,dimsize-1};
      int loA[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int hiA[DIM] = {dimsize-1,dimsize-1};
      int loB[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int hiB[DIM] = {dimsize-1,dimsize-1};
      int dims[DIM]={dimsize,dimsize};
      int ldb = hiB[0]-loB[0]+1;
      int ldc = hiC[0]-loC[0]+1;
      int lda = hiA[0]-loA[0]+1;
      int nlo, ldC;

      char* read_only = "read_only";
      char* read_cache = "read_cache";

      //subarray variables
      int sub_size;
      int *fullarray_test = (int*)malloc(full_size*sizeof(int));
      int *subarray_test;
      int loS[DIM], hiS[DIM];
      int lds;

      local_A=(int*)malloc(full_size*sizeof(int));
      for (i=0;i<full_size;i++){
        *(local_A + i) = i;
      }

      local_B=(int*)malloc(full_size*sizeof(int));
      for (i=0; i<full_size; i++){
        *(local_B + i) = i;
      }

      g_a = NGA_Create(C_INT, DIM, dims, "array_A", NULL);
      g_b = NGA_Create(C_INT, DIM, dims, "array_B", NULL);
      g_c = NGA_Create(C_INT, DIM, dims, "array_C", NULL);

      //fill GAs a and b with values to be multipled
      GA_Zero(g_a);
      GA_Zero(g_b);
      GA_Zero(g_c);

      NGA_Put(g_a, alo, ahi, local_A, &lda);
      NGA_Put(g_b, blo, bhi, local_B, &ldb);

      GA_Sync();
 
      if (test == 0) {
      NGA_Set_property(g_a, read_only);
      NGA_Set_property(g_b, read_only);
      }      
      if (test == 1) {
        NGA_Set_property(g_a, read_cache);
        NGA_Set_property(g_b, read_cache);
      }

      GA_Sync();

      delta_t = GA_Wtime();

      grid_factor(nprocs, &pdx, &pdy);

      //coordinates of processor for grid
      ipx = rank%pdx;
      ipy = (rank-ipx)/pdx; 
      xdim = dimsize;
      ydim = dimsize;

      if (dimsize <= 64) {
        xbl = dimsize/2;
        ybl = dimsize/2;
      } else {
        xbl = dimsize/2;
        ybl = dimsize/2;
      }

      //total number of blocks on each dimension
      xnbl = xdim/xbl;
      ynbl = ydim/ybl;
      if ((xnbl * xbl) < xdim) xnbl++;
      if ((ynbl * ybl) < ydim) ynbl++;

      xcnt = ipx;
      ycnt = ipy;

      GA_Sync();

      while (ycnt < ynbl) {
        int num_blocks, offset;
        int elemsize, ld;
        int *a_buf = NULL;
        int *b_buf = NULL;
        int *c_buf = NULL;
        int test_buf;
        int size_a, size_b, size_c;

        loC[0] = xcnt * xbl;
        loC[1] = ycnt * ybl;
        hiC[0] = (xcnt + 1) * xbl - 1;
        hiC[1] = (ycnt + 1) * ybl - 1;

        if (hiC[0] >= xdim) hiC[0] = xdim - 1;
        if (hiC[0] >= ydim) hiC[0] = ydim - 1;

	// stop to avoid FPE
	if ( hiC[0] < loC[0] ){
	  fprintf(stderr,"%d: bad values for HiC LoC: %d  %d\n", rank, hiC[0], loC[0]);
	  fprintf(stderr,"%dL xcnt xbl: %d  %d\n", rank, xcnt, xbl);
	  GA_Error("cache_test: div by zero", 0);
	}
        // Calculating number of blocks for inner dimension
        num_blocks = dimsize/(hiC[0]-loC[0]+1);
        if (num_blocks*(hiC[0]-loC[0]+1) < dimsize) num_blocks++;

        //set up buffers
        offset = 0;
        elemsize = sizeof(int);

        c_buf = (void*)malloc((hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1)*elemsize);
        a_buf = (void*)malloc((hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1)*elemsize);
        b_buf = (void*)malloc((hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1)*elemsize);
        
        test_buf = (hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1)*elemsize;
        size_c = (hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1);
        ldC = hiC[1]-loC[1]+1;
        
        // calculate starting block index
        istart = (loC[0]-clo[0])/(hiC[0]-loC[0]+1);
        
        // loop over block pairs
        for (nb=0; nb<num_blocks; nb++) {
          
          ind = istart + nb;
          ind = ind%num_blocks;
          
          nlo = alo[1]+ind*(hiC[0]-loC[0]+1);
          loA[0] = loC[0];
          hiA[0] = hiC[0];
          loA[1] = nlo;
          hiA[1] = loA[1]+(hiC[0]-loC[0]);
          if (hiA[1] > ahi[1]) hiA[1] = ahi[1];
          ld = hiA[0]-loA[0]+1;
          size_a = (hiA[0]-loA[0]+1)*(hiA[1]-loA[1]+1);
          
          NGA_Get(g_a,loA,hiA,a_buf,&ld);       
          
          if (dimsize > 4) {
          sub_size = (hiC[0]-loC[0]-1)*(hiC[1]-loC[1]-1);
          subarray_test = (int*)malloc(sub_size*sizeof(int)); 
          
          loS[0] = loA[0]+1;
          loS[1] = loA[1]+1;
          hiS[0] = hiA[0]-1;
          hiS[1] = hiA[1]-1;
          lds = hiS[0]-loS[0]+1;

          NGA_Get(g_a,loS,hiS,subarray_test,&lds);
          }          

          loB[1] = loC[1];
          hiB[1] = hiC[1];
          nlo = blo[0]+ind*(hiC[0]-loC[0]+1);
          loB[0] = nlo;
          hiB[0] = loB[0]+(hiC[0]-loC[0]);
          if (hiB[0] > bhi[0]) hiB[0] = bhi[0];
          ld = hiB[0]-loB[0]+1;
          size_b = (hiB[0]-loB[0]+1)*(hiB[1]-loB[1]+1);        

          NGA_Get(g_b,loB,hiB,b_buf,&ld);

          xcdim = hiC[0] - loC[0] + 1;
          ycdim = hiC[1] - loC[1] + 1;

          for (i = 0; i < xcdim; i++) {
            for (j = 0; j < ycdim; j++) {
              c_buf[i*ycdim+j] = 0.0;
            }
          }
          //transpose B to reduce page faults
          kdim = hiA[1] - loA[1] + 1;
          for (i = 0; i < xcdim; i++) {
            for (j = 0; j < ycdim; j++) {
              for (k = 0; k < kdim; k++) {
                c_buf[i*ycdim+j] += a_buf[i*kdim+k]*b_buf[k*ycdim+j];
              }
            }
          }

          NGA_Acc(g_c, loC, hiC, c_buf, &ldC, &one);

        }
         
        // multiplication is done, free buffers 
        free(a_buf);
        free(b_buf);
        free(c_buf);

        xcnt += pdx;

        if (xcnt >= xnbl) {
          xcnt = ipx;
          ycnt += pdy;
        }
      }

      delta_t = GA_Wtime()-delta_t;      
      if (dimsize == 0 & rank == 0) printf("\n"); 
      if (test == 0 && rank == 0) printf("READ  - DIMSIZE: %5d  Time (us): %7.4f\n",dimsize,delta_t*1.0e6);
      if (test == 1 && rank == 0) printf("CACHE - DIMSIZE: %5d  Time (us): %7.4f\n",dimsize,delta_t*1.0e6);

      GA_Sync();
      NGA_Unset_property(g_a);
      NGA_Unset_property(g_b);

#if 0 
      /* check multipy for correctness */
      abuf = (int*)malloc(sizeof(int)*dimsize*dimsize);
      bbuf = (int*)malloc(sizeof(int)*dimsize*dimsize);
      cbuf = (int*)malloc(sizeof(int)*dimsize*dimsize);
      ctest = (int*)malloc(sizeof(int)*dimsize*dimsize);
      /* get data from matrices a, b, c */
      NGA_Get(g_a,alo,ahi,abuf,&dimsize);
      NGA_Get(g_b,blo,bhi,bbuf,&dimsize);
      NGA_Get(g_c,clo,chi,ctest,&dimsize);
      for (i=0; i<dimsize; i++) {
        for (j=0; j<dimsize; j++) {
          cbuf[i*dimsize+j] = 0;
          for (k=0; k<dimsize; k++) {
            cbuf[i*dimsize+j] += abuf[i*dimsize+k]*bbuf[k*dimsize+j];
          }
          if (cbuf[i*dimsize+j] != ctest[i*dimsize+j] && rank == 0) {
            printf("mismatch for pair [%d,%d] expected: %d actual: %d\n",i,j,
                cbuf[i*dimsize+j],ctest[i*dimsize+j]);
          }
        }
      }
      free(abuf);
      free(bbuf);
      free(cbuf);
      free(ctest);
#endif

      GA_Destroy(g_a);
      GA_Destroy(g_b);
      GA_Destroy(g_c);
      free(local_A);
      free(local_B);     
    }
  }
  GA_Terminate();
  MPI_Finalize();
}